

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O3

void __thiscall TCPServer::TCPServer(TCPServer *this,string *nm,SessionFactory *factory,int port)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  socklen_t len;
  int yes;
  sockaddr local_58;
  string local_48;
  socklen_t local_28 [2];
  
  local_48._M_dataplus._M_p = (nm->_M_dataplus)._M_p;
  paVar1 = &nm->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == paVar1) {
    local_48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_48.field_2._8_8_ = *(undefined8 *)((long)&nm->field_2 + 8);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_48._M_string_length = nm->_M_string_length;
  (nm->_M_dataplus)._M_p = (pointer)paVar1;
  nm->_M_string_length = 0;
  (nm->field_2)._M_local_buf[0] = '\0';
  Subscriber::Subscriber(&this->super_Subscriber,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (this->super_Subscriber)._vptr_Subscriber = (_func_int **)&PTR_on_error_00139c18;
  *(undefined8 *)&(this->client_factory).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->client_factory).super__Function_base._M_functor + 8) = 0;
  (this->client_factory).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->client_factory)._M_invoker = factory->_M_invoker;
  if ((factory->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar2 = *(undefined8 *)((long)&(factory->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->client_factory).super__Function_base._M_functor =
         *(undefined8 *)&(factory->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->client_factory).super__Function_base._M_functor + 8) = uVar2;
    (this->client_factory).super__Function_base._M_manager =
         (factory->super__Function_base)._M_manager;
    (factory->super__Function_base)._M_manager = (_Manager_type)0x0;
    factory->_M_invoker = (_Invoker_type)0x0;
  }
  local_58.sa_data[6] = '\0';
  local_58.sa_data[7] = '\0';
  local_58.sa_data[8] = '\0';
  local_58.sa_data[9] = '\0';
  local_58.sa_data[10] = '\0';
  local_58.sa_data[0xb] = '\0';
  local_58.sa_data[0xc] = '\0';
  local_58.sa_data[0xd] = '\0';
  local_58.sa_family = 2;
  local_58.sa_data[2] = '\0';
  local_58.sa_data[3] = '\0';
  local_58.sa_data[4] = '\0';
  local_58.sa_data[5] = '\0';
  local_58.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
  iVar3 = socket(2,1,0);
  iVar3 = no_err(iVar3,"create socket");
  local_28[1] = 1;
  iVar4 = setsockopt(iVar3,1,2,local_28 + 1,4);
  no_err(iVar4,"setsockopt reuseaddr");
  iVar4 = bind(iVar3,&local_58,0x10);
  no_err(iVar4,"bind");
  iVar4 = listen(iVar3,5);
  no_err(iVar4,"listen");
  Subscriber::set_fd(&this->super_Subscriber,iVar3);
  Subscriber::set_expected(&this->super_Subscriber,1);
  local_28[0] = 0x10;
  iVar3 = getsockname(iVar3,&local_58,local_28);
  no_err(iVar3,"getsockname");
  this->port = (uint)(ushort)(local_58.sa_data._0_2_ << 8 | (ushort)local_58.sa_data._0_2_ >> 8);
  return;
}

Assistant:

TCPServer::TCPServer(std::string nm, TCPServer::SessionFactory factory, int port) :
    Subscriber(std::move(nm)),
    client_factory(std::move(factory)) {
  struct sockaddr_in server_address{};
  server_address.sin_family = AF_INET; // IPv4
  server_address.sin_addr.s_addr = htonl(INADDR_ANY); // listening on all interfaces
  server_address.sin_port = htons(port);
  int sock = no_err(socket(PF_INET, SOCK_STREAM, 0), "create socket"); // creating IPv4 TCP file_desc

  int yes = 1;
  no_err(setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof(int)), "setsockopt reuseaddr");
  no_err(bind(sock, (struct sockaddr *) &server_address, sizeof(server_address)), "bind");
  // switch to listening (passive open)
  no_err(listen(sock, 5), "listen");
  set_fd(sock);
  set_expected(POLLIN);
  socklen_t len = sizeof(server_address);
  no_err(getsockname(sock, (struct sockaddr *) &server_address, &len), "getsockname");
  this->port = ntohs(server_address.sin_port);
}